

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudDrv_Pulse.c
# Opt level: O3

UINT8 Pulse_Deinit(void)

{
  UINT8 UVar1;
  
  UVar1 = '\x18';
  if (isInit == '\x01') {
    deviceList.devCount = 0;
    deviceList.devNames = (char **)0x0;
    isInit = '\0';
    UVar1 = '\0';
  }
  return UVar1;
}

Assistant:

UINT8 Pulse_Deinit(void)
{
	if (! isInit)
		return AERR_WASDONE;
	
	deviceList.devCount = 0;
	deviceList.devNames = NULL;
	
	isInit = 0;
	
	return AERR_OK;
}